

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<kj::String>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::String>::apply
          (Maybe<kj::Array<kj::String>_> *__return_storage_ptr__,
          Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>
          *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  ParserInput subInput;
  NullableValue<kj::String> subResult;
  Results results;
  ParserInput local_c8;
  NullableValue<kj::String> local_98;
  ArrayBuilder<kj::String> local_78;
  NullableValue<kj::String> local_50;
  
  local_78.ptr = (String *)0x0;
  local_78.pos = (String *)0x0;
  local_78.endPtr = (String *)0x0;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) {
LAB_001f4103:
      if (local_78.pos == local_78.ptr) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        Vector<kj::String>::releaseAsArray
                  ((Array<kj::String> *)&local_c8,(Vector<kj::String> *)&local_78);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.ptr =
             (String *)local_c8.super_IteratorInput<char,_const_char_*>.parent;
        (__return_storage_ptr__->ptr).field_1.value.size_ =
             (size_t)local_c8.super_IteratorInput<char,_const_char_*>.pos;
        (__return_storage_ptr__->ptr).field_1.value.disposer =
             (ArrayDisposer *)local_c8.super_IteratorInput<char,_const_char_*>.end;
        local_c8.super_IteratorInput<char,_const_char_*>.parent =
             (IteratorInput<char,_const_char_*> *)0x0;
        local_c8.super_IteratorInput<char,_const_char_*>.pos = (char *)0x0;
        Array<kj::String>::~Array((Array<kj::String> *)&local_c8);
      }
      ArrayBuilder<kj::String>::dispose(&local_78);
      return __return_storage_ptr__;
    }
    local_c8.begin = input->begin;
    local_c8.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_c8.super_IteratorInput<char,_const_char_*>.pos = (char *)pAVar1;
    local_c8.super_IteratorInput<char,_const_char_*>.end = (char *)pAVar2;
    local_c8.super_IteratorInput<char,_const_char_*>.best = (char *)pAVar1;
    Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'#'>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,_'_'>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,_'\n'>,_const_kj::parse::EndOfInput__&>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>
              ((Maybe<kj::String> *)&local_50,subParser,&local_c8);
    local_98.isSet = local_50.isSet;
    if (local_50.isSet == true) {
      local_98.field_1.value.content.ptr = local_50.field_1.value.content.ptr;
      local_98.field_1.value.content.size_ = local_50.field_1.value.content.size_;
      local_98.field_1.value.content.disposer = local_50.field_1.value.content.disposer;
      local_50.field_1.value.content.ptr = (char *)0x0;
      local_50.field_1.value.content.size_ = 0;
    }
    kj::_::NullableValue<kj::String>::~NullableValue(&local_50);
    if (local_98.isSet != true) {
      kj::_::NullableValue<kj::String>::~NullableValue(&local_98);
      IteratorInput<char,_const_char_*>::~IteratorInput
                (&local_c8.super_IteratorInput<char,_const_char_*>);
      goto LAB_001f4103;
    }
    ((IteratorInput<char,_const_char_*> *)
    &(local_c8.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
         local_c8.super_IteratorInput<char,_const_char_*>.pos;
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_78,&local_98.field_1.value);
    kj::_::NullableValue<kj::String>::~NullableValue(&local_98);
    IteratorInput<char,_const_char_*>::~IteratorInput
              (&local_c8.super_IteratorInput<char,_const_char_*>);
  } while( true );
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }